

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

index_t __thiscall xLearn::InmemReader::Samples(InmemReader *this,DMatrix **matrix)

{
  value_type vVar1;
  value_type pvVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  reference pvVar3;
  reference ppvVar4;
  reference pvVar5;
  long *in_RSI;
  long in_RDI;
  int i;
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  value_type in_stack_ffffffffffffffc4;
  uint local_1c;
  
  local_1c = 0;
  do {
    if (*(uint *)(in_RDI + 0x140) <= local_1c) {
LAB_0015a03c:
      *in_RSI = in_RDI + 0x28;
      return *(index_t *)(in_RDI + 0x140);
    }
    if (*(uint *)(in_RDI + 0xe8) <= *(uint *)(in_RDI + 0x144)) {
      if (local_1c == 0) {
        if ((*(byte *)(in_RDI + 0x99) & 1) != 0) {
          srand(*(int *)(in_RDI + 0xd0) + 1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff98);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff98);
          __first._M_current._4_4_ = in_stack_ffffffffffffffc4;
          __first._M_current._0_4_ = in_stack_ffffffffffffffc0;
          std::
          random_shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (__first,in_stack_ffffffffffffffb8);
        }
        *in_RSI = 0;
        return 0;
      }
      goto LAB_0015a03c;
    }
    in_stack_ffffffffffffff98 =
         (vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
          *)(in_RDI + 0xf0);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x148),
                        (ulong)*(uint *)(in_RDI + 0x144));
    ppvVar4 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[](in_stack_ffffffffffffff98,(ulong)*pvVar3);
    pvVar2 = *ppvVar4;
    ppvVar4 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(in_RDI + 0x40),(long)(int)local_1c);
    *ppvVar4 = pvVar2;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x148),
                        (ulong)*(uint *)(in_RDI + 0x144));
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x108),(ulong)*pvVar3);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x58),(long)(int)local_1c
                       );
    *pvVar5 = vVar1;
    in_stack_ffffffffffffffb8._M_current = (uint *)(in_RDI + 0x120);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x148),
                        (ulong)*(uint *)(in_RDI + 0x144));
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        in_stack_ffffffffffffffb8._M_current,(ulong)*pvVar3);
    in_stack_ffffffffffffffc4 = *pvVar5;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x70),(long)(int)local_1c
                       );
    *pvVar5 = in_stack_ffffffffffffffc4;
    *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) + 1;
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

index_t InmemReader::Samples(DMatrix* &matrix) {
  for (int i = 0; i < num_samples_; ++i) {
    if (pos_ >= data_buf_.row_length) {
      // End of the data buffer
      if (i == 0) {
        if (shuffle_) {
          srand(this->seed_+1);
          random_shuffle(order_.begin(), order_.end());
        }
        matrix = nullptr;
        return 0;
      }
      break;
    }
    // Copy data between different DMatrix.
    data_samples_.row[i] = data_buf_.row[order_[pos_]];
    data_samples_.Y[i] = data_buf_.Y[order_[pos_]];
    data_samples_.norm[i] = data_buf_.norm[order_[pos_]];
    pos_++;
  }
  matrix = &data_samples_;
  return num_samples_;
}